

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgstrs.c
# Opt level: O1

void sgstrs(trans_t trans,SuperMatrix *L,SuperMatrix *U,int *perm_c,int *perm_r,SuperMatrix *B,
           SuperLUStat_t *stat,int *info)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int *piVar5;
  float *pfVar6;
  void *pvVar7;
  long lVar8;
  void *pvVar9;
  long lVar10;
  bool bVar11;
  float *Mxvec;
  float *addr;
  long lVar12;
  ulong uVar13;
  float *pfVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  int iVar22;
  ulong uVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  ulong uVar29;
  float fVar30;
  int ii;
  
  *info = 0;
  piVar5 = (int *)B->Store;
  iVar1 = *piVar5;
  lVar28 = (long)iVar1;
  uVar2 = B->ncol;
  uVar29 = (ulong)uVar2;
  iVar15 = -1;
  if (trans < (CONJ|TRANS)) {
    iVar16 = L->nrow;
    iVar15 = -2;
    if ((((-1 < iVar16) && (iVar16 == L->ncol)) && (L->Stype == SLU_SC)) &&
       ((L->Dtype == SLU_S && (L->Mtype == SLU_TRLU)))) {
      iVar15 = -3;
      if (((-1 < U->nrow) && ((U->nrow == U->ncol && (U->Stype == SLU_NC)))) &&
         ((U->Dtype == SLU_S &&
          ((((U->Mtype == SLU_TRU && (iVar15 = -6, iVar16 <= iVar1)) && (B->Stype == SLU_DN)) &&
           ((B->Dtype == SLU_S && (B->Mtype == SLU_GE)))))))) goto LAB_00105c95;
    }
  }
  *info = iVar15;
LAB_00105c95:
  if (*info == 0) {
    uVar3 = L->nrow;
    uVar23 = (ulong)uVar3;
    Mxvec = floatCalloc((long)(int)uVar2 * (long)(int)uVar3);
    if (Mxvec == (float *)0x0) {
      sprintf((char *)&ii,"%s at line %d in file %s\n","Malloc fails for local work[].",0x8c,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/sgstrs.c");
      superlu_abort_and_exit((char *)&ii);
    }
    addr = floatMalloc((long)(int)uVar3);
    if (addr == (float *)0x0) {
      sprintf((char *)&ii,"%s at line %d in file %s\n","Malloc fails for local soln[].",0x8e,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/sgstrs.c");
      superlu_abort_and_exit((char *)&ii);
    }
    pfVar6 = *(float **)(piVar5 + 2);
    if (trans == NOTRANS) {
      pvVar7 = L->Store;
      lVar8 = *(long *)((long)pvVar7 + 8);
      pvVar9 = U->Store;
      lVar10 = *(long *)((long)pvVar9 + 8);
      if (0 < (int)uVar2) {
        uVar13 = 0;
        pfVar14 = pfVar6;
        do {
          if (0 < (int)uVar3) {
            uVar20 = 0;
            do {
              addr[perm_r[uVar20]] = pfVar14[uVar20];
              uVar20 = uVar20 + 1;
            } while (uVar23 != uVar20);
          }
          if (0 < (int)uVar3) {
            uVar20 = 0;
            do {
              pfVar14[uVar20] = addr[uVar20];
              uVar20 = uVar20 + 1;
            } while (uVar23 != uVar20);
          }
          uVar13 = uVar13 + 1;
          pfVar14 = pfVar14 + lVar28;
        } while (uVar13 != uVar29);
      }
      uVar17 = *(uint *)((long)pvVar7 + 4);
      if ((int)uVar17 < 0) {
        fVar30 = 0.0;
      }
      else {
        fVar30 = 0.0;
        lVar12 = 0;
        do {
          lVar27 = (long)*(int *)(*(long *)((long)pvVar7 + 0x30) + lVar12 * 4);
          uVar17 = *(uint *)(*(long *)((long)pvVar7 + 0x20) + lVar27 * 4);
          iVar1 = *(int *)(*(long *)((long)pvVar7 + 0x20) + 4 + lVar27 * 4);
          iVar22 = iVar1 - uVar17;
          lVar21 = *(int *)(*(long *)((long)pvVar7 + 0x30) + 4 + lVar12 * 4) - lVar27;
          iVar16 = (int)lVar21;
          iVar15 = iVar22 - iVar16;
          if (iVar16 == 1) {
            if (0 < (int)uVar2) {
              iVar22 = *(int *)(*(long *)((long)pvVar7 + 0x10) + lVar27 * 4);
              uVar23 = 0;
              do {
                if ((int)(uVar17 + 1) < iVar1) {
                  lVar24 = uVar23 * lVar28;
                  lVar21 = *(long *)((long)pvVar7 + 0x18);
                  lVar25 = 0;
                  do {
                    lVar19 = (long)*(int *)(lVar21 + (long)(int)uVar17 * 4 + 4 + lVar25 * 4);
                    pfVar6[lVar24 + lVar19] =
                         pfVar6[lVar24 + lVar19] -
                         pfVar6[lVar24 + lVar27] *
                         *(float *)(lVar8 + 4 + (long)iVar22 * 4 + lVar25 * 4);
                    lVar25 = lVar25 + 1;
                  } while (~uVar17 + iVar1 != (int)lVar25);
                }
                uVar23 = uVar23 + 1;
              } while (uVar23 != uVar29);
            }
          }
          else if (0 < (int)uVar2) {
            lVar24 = (long)*(int *)(*(long *)((long)pvVar7 + 0x10) + lVar27 * 4);
            uVar23 = 0;
            do {
              lVar25 = uVar23 * lVar28;
              slsolve(iVar22,iVar16,(float *)(lVar8 + lVar24 * 4),pfVar6 + lVar25 + lVar27);
              smatvec(iVar22,iVar15,iVar16,(float *)(lVar8 + (lVar21 + lVar24) * 4),
                      pfVar6 + lVar25 + lVar27,Mxvec);
              if (0 < iVar15) {
                lVar19 = *(long *)((long)pvVar7 + 0x18);
                lVar26 = 0;
                do {
                  lVar18 = (long)*(int *)(lVar19 + (long)(int)(uVar17 + iVar16) * 4 + lVar26 * 4);
                  pfVar6[lVar25 + lVar18] = pfVar6[lVar25 + lVar18] - Mxvec[lVar26];
                  Mxvec[lVar26] = 0.0;
                  lVar26 = lVar26 + 1;
                } while (lVar26 < iVar15);
              }
              uVar23 = uVar23 + 1;
            } while (uVar23 != uVar29);
          }
          fVar30 = (float)(int)(uVar2 * 2 * iVar16 * iVar15) +
                   fVar30 + (float)(int)(iVar16 * uVar2 * (iVar16 + -1));
          uVar17 = *(uint *)((long)pvVar7 + 4);
          bVar11 = lVar12 < (int)uVar17;
          lVar12 = lVar12 + 1;
        } while (bVar11);
      }
      if (-1 < (int)uVar17) {
        uVar23 = (ulong)uVar17;
        do {
          iVar1 = *(int *)(*(long *)((long)pvVar7 + 0x30) + uVar23 * 4);
          lVar21 = (long)iVar1;
          iVar15 = *(int *)(*(long *)((long)pvVar7 + 0x30) + 4 + uVar23 * 4);
          iVar16 = iVar15 - iVar1;
          lVar12 = (long)*(int *)(*(long *)((long)pvVar7 + 0x10) + lVar21 * 4);
          if (iVar16 == 1) {
            if (0 < (int)uVar2) {
              pfVar14 = pfVar6 + lVar21;
              uVar13 = uVar29;
              do {
                *pfVar14 = *pfVar14 / *(float *)(lVar8 + lVar12 * 4);
                pfVar14 = pfVar14 + lVar28;
                uVar17 = (int)uVar13 - 1;
                uVar13 = (ulong)uVar17;
              } while (uVar17 != 0);
            }
          }
          else if (0 < (int)uVar2) {
            iVar22 = *(int *)(*(long *)((long)pvVar7 + 0x20) + 4 + lVar21 * 4);
            iVar4 = *(int *)(*(long *)((long)pvVar7 + 0x20) + lVar21 * 4);
            pfVar14 = pfVar6 + lVar21;
            uVar13 = uVar29;
            do {
              susolve(iVar22 - iVar4,iVar16,(float *)(lVar8 + lVar12 * 4),pfVar14);
              pfVar14 = pfVar14 + lVar28;
              uVar13 = uVar13 - 1;
            } while (uVar13 != 0);
          }
          fVar30 = fVar30 + (float)(int)(iVar16 * uVar2 * (iVar16 + 1));
          if (0 < (int)uVar2) {
            uVar13 = 0;
            do {
              if (iVar1 < iVar15) {
                lVar24 = uVar13 * lVar28;
                lVar12 = *(long *)((long)pvVar9 + 0x18);
                lVar27 = lVar21;
                do {
                  iVar16 = *(int *)(lVar12 + 4 + lVar27 * 4);
                  iVar22 = *(int *)(lVar12 + lVar27 * 4);
                  lVar25 = (long)iVar22;
                  if (iVar16 - iVar22 != 0 && iVar22 <= iVar16) {
                    lVar19 = *(long *)((long)pvVar9 + 0x10);
                    do {
                      lVar26 = (long)*(int *)(lVar19 + lVar25 * 4);
                      pfVar6[lVar24 + lVar26] =
                           pfVar6[lVar24 + lVar26] -
                           pfVar6[lVar24 + lVar27] * *(float *)(lVar10 + lVar25 * 4);
                      lVar25 = lVar25 + 1;
                    } while (iVar16 != lVar25);
                  }
                  lVar27 = lVar27 + 1;
                  fVar30 = fVar30 + (float)((iVar16 - iVar22) * 2);
                } while (lVar27 != iVar15);
              }
              uVar13 = uVar13 + 1;
            } while (uVar13 != uVar29);
          }
          bVar11 = 0 < (long)uVar23;
          uVar23 = uVar23 - 1;
        } while (bVar11);
      }
      if (0 < (int)uVar2) {
        uVar23 = 0;
        pfVar14 = pfVar6;
        do {
          if (0 < (int)uVar3) {
            uVar13 = 0;
            do {
              addr[uVar13] = pfVar6[uVar23 * lVar28 + (long)perm_c[uVar13]];
              uVar13 = uVar13 + 1;
            } while (uVar3 != uVar13);
          }
          if (0 < (int)uVar3) {
            uVar13 = 0;
            do {
              pfVar14[uVar13] = addr[uVar13];
              uVar13 = uVar13 + 1;
            } while (uVar3 != uVar13);
          }
          uVar23 = uVar23 + 1;
          pfVar14 = pfVar14 + lVar28;
        } while (uVar23 != uVar29);
      }
      stat->ops[0x11] = fVar30;
    }
    else {
      if (0 < (int)uVar2) {
        uVar13 = 0;
        pfVar14 = pfVar6;
        do {
          if (0 < (int)uVar3) {
            uVar20 = 0;
            do {
              addr[perm_c[uVar20]] = pfVar14[uVar20];
              uVar20 = uVar20 + 1;
            } while (uVar23 != uVar20);
          }
          if (0 < (int)uVar3) {
            uVar20 = 0;
            do {
              pfVar14[uVar20] = addr[uVar20];
              uVar20 = uVar20 + 1;
            } while (uVar23 != uVar20);
          }
          uVar13 = uVar13 + 1;
          pfVar14 = pfVar14 + lVar28;
        } while (uVar13 != uVar29);
      }
      stat->ops[0x11] = 0.0;
      uVar13 = uVar29;
      pfVar14 = pfVar6;
      if (0 < (int)uVar2) {
        do {
          sp_strsv("U","T","N",L,U,pfVar14,stat,info);
          sp_strsv("L","T","U",L,U,pfVar14,stat,info);
          uVar13 = uVar13 - 1;
          pfVar14 = pfVar14 + lVar28;
        } while (uVar13 != 0);
      }
      if (0 < (int)uVar2) {
        uVar13 = 0;
        pfVar14 = pfVar6;
        do {
          if (0 < (int)uVar3) {
            uVar20 = 0;
            do {
              addr[uVar20] = pfVar6[uVar13 * lVar28 + (long)perm_r[uVar20]];
              uVar20 = uVar20 + 1;
            } while (uVar23 != uVar20);
          }
          if (0 < (int)uVar3) {
            uVar20 = 0;
            do {
              pfVar14[uVar20] = addr[uVar20];
              uVar20 = uVar20 + 1;
            } while (uVar23 != uVar20);
          }
          uVar13 = uVar13 + 1;
          pfVar14 = pfVar14 + lVar28;
        } while (uVar13 != uVar29);
      }
    }
    superlu_free(Mxvec);
    superlu_free(addr);
  }
  else {
    ii = -*info;
    input_error("sgstrs",&ii);
  }
  return;
}

Assistant:

void
sgstrs (trans_t trans, SuperMatrix *L, SuperMatrix *U,
        const int *perm_c, const int *perm_r, SuperMatrix *B,
        SuperLUStat_t *stat, int *info)
{

#ifdef _CRAY
    _fcd ftcs1, ftcs2, ftcs3, ftcs4;
#endif
#ifdef USE_VENDOR_BLAS
    float   alpha = 1.0, beta = 1.0;
    float   *work_col;
#endif
    DNformat *Bstore;
    float   *Bmat;
    SCformat *Lstore;
    NCformat *Ustore;
    float   *Lval, *Uval;
    int      fsupc, nrow, nsupr, nsupc, irow;
    int_t    i, j, k, luptr, istart, iptr;
    int      jcol, n, ldb, nrhs;
    float   *work, *rhs_work, *soln;
    flops_t  solve_ops;
    void sprint_soln(int n, int nrhs, const float *soln);

    /* Test input parameters ... */
    *info = 0;
    Bstore = B->Store;
    ldb = Bstore->lda;
    nrhs = B->ncol;
    if ( trans != NOTRANS && trans != TRANS && trans != CONJ ) *info = -1;
    else if ( L->nrow != L->ncol || L->nrow < 0 ||
	      L->Stype != SLU_SC || L->Dtype != SLU_S || L->Mtype != SLU_TRLU )
	*info = -2;
    else if ( U->nrow != U->ncol || U->nrow < 0 ||
	      U->Stype != SLU_NC || U->Dtype != SLU_S || U->Mtype != SLU_TRU )
	*info = -3;
    else if ( ldb < SUPERLU_MAX(0, L->nrow) ||
	      B->Stype != SLU_DN || B->Dtype != SLU_S || B->Mtype != SLU_GE )
	*info = -6;
    if ( *info ) {
	int ii = -(*info);
	input_error("sgstrs", &ii);
	return;
    }

    n = L->nrow;
    work = floatCalloc((size_t) n * (size_t) nrhs);
    if ( !work ) ABORT("Malloc fails for local work[].");
    soln = floatMalloc((size_t) n);
    if ( !soln ) ABORT("Malloc fails for local soln[].");

    Bmat = Bstore->nzval;
    Lstore = L->Store;
    Lval = Lstore->nzval;
    Ustore = U->Store;
    Uval = Ustore->nzval;
    solve_ops = 0;
    
    if ( trans == NOTRANS ) {
	/* Permute right hand sides to form Pr*B */
	for (i = 0; i < nrhs; i++) {
	    rhs_work = &Bmat[(size_t)i * (size_t)ldb];
	    for (k = 0; k < n; k++) soln[perm_r[k]] = rhs_work[k];
	    for (k = 0; k < n; k++) rhs_work[k] = soln[k];
	}
	
	/* Forward solve PLy=Pb. */
	for (k = 0; k <= Lstore->nsuper; k++) {
	    fsupc = L_FST_SUPC(k);
	    istart = L_SUB_START(fsupc);
	    nsupr = L_SUB_START(fsupc+1) - istart;
	    nsupc = L_FST_SUPC(k+1) - fsupc;
	    nrow = nsupr - nsupc;

	    solve_ops += nsupc * (nsupc - 1) * nrhs;
	    solve_ops += 2 * nrow * nsupc * nrhs;
	    
	    if ( nsupc == 1 ) {
		for (j = 0; j < nrhs; j++) {
		    rhs_work = &Bmat[(size_t)j * (size_t)ldb];
	    	    luptr = L_NZ_START(fsupc);
		    for (iptr=istart+1; iptr < L_SUB_START(fsupc+1); iptr++){
			irow = L_SUB(iptr);
			++luptr;
			rhs_work[irow] -= rhs_work[fsupc] * Lval[luptr];
		    }
		}
	    } else {
	    	luptr = L_NZ_START(fsupc);
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		ftcs1 = _cptofcd("L", strlen("L"));
		ftcs2 = _cptofcd("N", strlen("N"));
		ftcs3 = _cptofcd("U", strlen("U"));
		STRSM( ftcs1, ftcs1, ftcs2, ftcs3, &nsupc, &nrhs, &alpha,
		       &Lval[luptr], &nsupr, &Bmat[fsupc], &ldb);
		
		SGEMM( ftcs2, ftcs2, &nrow, &nrhs, &nsupc, &alpha, 
			&Lval[luptr+nsupc], &nsupr, &Bmat[fsupc], &ldb, 
			&beta, &work[0], &n );
#else
		strsm_("L", "L", "N", "U", &nsupc, &nrhs, &alpha,
		       &Lval[luptr], &nsupr, &Bmat[fsupc], &ldb);
		
		sgemm_( "N", "N", &nrow, &nrhs, &nsupc, &alpha, 
			&Lval[luptr+nsupc], &nsupr, &Bmat[fsupc], &ldb, 
			&beta, &work[0], &n );
#endif
		for (j = 0; j < nrhs; j++) {
		    rhs_work = &Bmat[(size_t)j * (size_t)ldb];
		    work_col = &work[(size_t)j * (size_t)n];
		    iptr = istart + nsupc;
		    for (i = 0; i < nrow; i++) {
			irow = L_SUB(iptr);
			rhs_work[irow] -= work_col[i]; /* Scatter */
			work_col[i] = 0.0;
			iptr++;
		    }
		}
#else		
		for (j = 0; j < nrhs; j++) {
		    rhs_work = &Bmat[(size_t)j * (size_t)ldb];
		    slsolve (nsupr, nsupc, &Lval[luptr], &rhs_work[fsupc]);
		    smatvec (nsupr, nrow, nsupc, &Lval[luptr+nsupc],
			    &rhs_work[fsupc], &work[0] );

		    iptr = istart + nsupc;
		    for (i = 0; i < nrow; i++) {
			irow = L_SUB(iptr);
			rhs_work[irow] -= work[i];
			work[i] = 0.0;
			iptr++;
		    }
		}
#endif		    
	    } /* else ... */
	} /* for L-solve */

#if ( DEBUGlevel>=2 )
  	printf("After L-solve: y=\n");
	sprint_soln(n, nrhs, Bmat);
#endif

	/*
	 * Back solve Ux=y.
	 */
	for (k = Lstore->nsuper; k >= 0; k--) {
	    fsupc = L_FST_SUPC(k);
	    istart = L_SUB_START(fsupc);
	    nsupr = L_SUB_START(fsupc+1) - istart;
	    nsupc = L_FST_SUPC(k+1) - fsupc;
	    luptr = L_NZ_START(fsupc);

	    solve_ops += nsupc * (nsupc + 1) * nrhs;

	    if ( nsupc == 1 ) {
		rhs_work = &Bmat[0];
		for (j = 0; j < nrhs; j++) {
		    rhs_work[fsupc] /= Lval[luptr];
		    rhs_work += ldb;
		}
	    } else {
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		ftcs1 = _cptofcd("L", strlen("L"));
		ftcs2 = _cptofcd("U", strlen("U"));
		ftcs3 = _cptofcd("N", strlen("N"));
		STRSM( ftcs1, ftcs2, ftcs3, ftcs3, &nsupc, &nrhs, &alpha,
		       &Lval[luptr], &nsupr, &Bmat[fsupc], &ldb);
#else
		strsm_("L", "U", "N", "N", &nsupc, &nrhs, &alpha,
		       &Lval[luptr], &nsupr, &Bmat[fsupc], &ldb);
#endif
#else		
		for (j = 0; j < nrhs; j++)
		    susolve ( nsupr, nsupc, &Lval[luptr], &Bmat[(size_t)fsupc + (size_t)j * (size_t)ldb] );
#endif		
	    }

	    for (j = 0; j < nrhs; ++j) {
		rhs_work = &Bmat[(size_t)j * (size_t)ldb];
		for (jcol = fsupc; jcol < fsupc + nsupc; jcol++) {
		    solve_ops += 2*(U_NZ_START(jcol+1) - U_NZ_START(jcol));
		    for (i = U_NZ_START(jcol); i < U_NZ_START(jcol+1); i++ ){
			irow = U_SUB(i);
			rhs_work[irow] -= rhs_work[jcol] * Uval[i];
		    }
		}
	    }
	    
	} /* for U-solve */

#if ( DEBUGlevel>=2 )
  	printf("After U-solve: x=\n");
	sprint_soln(n, nrhs, Bmat);
#endif

	/* Compute the final solution X := Pc*X. */
	for (i = 0; i < nrhs; i++) {
	    rhs_work = &Bmat[(size_t)i * (size_t)ldb];
	    for (k = 0; k < n; k++) soln[k] = rhs_work[perm_c[k]];
	    for (k = 0; k < n; k++) rhs_work[k] = soln[k];
	}
	
        stat->ops[SOLVE] = solve_ops;

    } else { /* Solve A'*X=B or CONJ(A)*X=B */
	/* Permute right hand sides to form Pc'*B. */
	for (i = 0; i < nrhs; i++) {
	    rhs_work = &Bmat[(size_t)i * (size_t)ldb];
	    for (k = 0; k < n; k++) soln[perm_c[k]] = rhs_work[k];
	    for (k = 0; k < n; k++) rhs_work[k] = soln[k];
	}

	stat->ops[SOLVE] = 0;
	for (k = 0; k < nrhs; ++k) {
	    
	    /* Multiply by inv(U'). */
	    sp_strsv("U", "T", "N", L, U, &Bmat[(size_t)k * (size_t)ldb], stat, info);
	    
	    /* Multiply by inv(L'). */
	    sp_strsv("L", "T", "U", L, U, &Bmat[(size_t)k * (size_t)ldb], stat, info);
	    
	}
	/* Compute the final solution X := Pr'*X (=inv(Pr)*X) */
	for (i = 0; i < nrhs; i++) {
	    rhs_work = &Bmat[(size_t)i * (size_t)ldb];
	    for (k = 0; k < n; k++) soln[k] = rhs_work[perm_r[k]];
	    for (k = 0; k < n; k++) rhs_work[k] = soln[k];
	}

    }

    SUPERLU_FREE(work);
    SUPERLU_FREE(soln);
}